

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *poVar2;
  char cVar3;
  StringRef passOrFail;
  int iVar4;
  size_type sVar5;
  Code colour;
  char *pcVar6;
  size_type in_R9;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  StringRef lhs;
  StringRef rhs;
  Colour colourGuard;
  AssertionPrinter printer;
  char local_79;
  AssertionPrinter local_78;
  string local_40;
  
  iVar4 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  local_78.printInfoMessages = true;
  if (((char)iVar4 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (local_78.printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  local_78.stream = (this->super_StreamingReporterBase).stream;
  local_78.result = &_assertionStats->assertionResult;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_78.messages,&_assertionStats->infoMessages);
  local_78.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  Colour::use(FileName);
  poVar2 = local_78.stream;
  local_40._M_dataplus._M_p =
       (((AssertionResult *)&(local_78.result)->m_info)->m_info).lineInfo.file;
  local_40._M_string_length =
       (((AssertionResult *)&(local_78.result)->m_info)->m_info).lineInfo.line;
  operator<<(local_78.stream,(SourceLineInfo *)&local_40);
  local_79 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_79,1);
  Colour::use(None);
  local_78.itMessage._M_current =
       local_78.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  OVar1 = (((AssertionResult *)&(local_78.result)->m_info)->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 == ExplicitFailure) {
        passOrFail_04.m_size = 6;
        passOrFail_04.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_04);
        colour = None;
        anon_unknown_23::AssertionPrinter::printIssue
                  ((AssertionPrinter *)local_78.stream,"explicitly");
        goto LAB_00156baf;
      }
      if (OVar1 != Exception) goto LAB_00156bbb;
      goto switchD_00156958_caseD_ffffffff;
    }
    if (OVar1 == ThrewException) {
      passOrFail_06.m_size = 6;
      passOrFail_06.m_start = "failed";
      anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_06);
      pcVar6 = "unexpected exception with message:";
LAB_00156ae0:
      anon_unknown_23::AssertionPrinter::printIssue((AssertionPrinter *)local_78.stream,pcVar6);
      anon_unknown_23::AssertionPrinter::printMessage(&local_78);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) goto LAB_00156bbb;
        passOrFail_01.m_size = 6;
        passOrFail_01.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_01);
        pcVar6 = "fatal error condition with message:";
        goto LAB_00156ae0;
      }
      passOrFail_05.m_size = 6;
      passOrFail_05.m_start = "failed";
      anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_05);
      anon_unknown_23::AssertionPrinter::printIssue
                ((AssertionPrinter *)local_78.stream,"expected exception, got none");
    }
    colour = FileName;
    anon_unknown_23::AssertionPrinter::printExpressionWas(&local_78);
    goto LAB_00156baf;
  }
  switch(OVar1) {
  case Ok:
    passOrFail_00.m_size = 6;
    passOrFail_00.m_start = "passed";
    anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightGreen,passOrFail_00);
    anon_unknown_23::AssertionPrinter::printOriginalExpression(&local_78);
    anon_unknown_23::AssertionPrinter::printReconstructedExpression(&local_78);
    colour = FileName;
    if ((((AssertionResult *)&(local_78.result)->m_info)->m_info).capturedExpression.m_size == 0) {
      colour = None;
    }
    goto LAB_00156baf;
  case Info:
    sVar5 = 4;
    pcVar6 = "info";
    goto LAB_00156b22;
  case Warning:
    sVar5 = 7;
    pcVar6 = "warning";
LAB_00156b22:
    passOrFail_07.m_size = sVar5;
    passOrFail_07.m_start = pcVar6;
    anon_unknown_23::AssertionPrinter::printResultType(&local_78,None,passOrFail_07);
    colour = FileName;
    anon_unknown_23::AssertionPrinter::printMessage(&local_78);
LAB_00156baf:
    anon_unknown_23::AssertionPrinter::printRemainingMessages(&local_78,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) break;
      if (((((AssertionResult *)&(local_78.result)->m_info)->m_info).resultDisposition &
          SuppressFail) == 0) {
        passOrFail_02.m_size = 6;
        passOrFail_02.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_02);
      }
      else {
        lhs.m_size = (size_type)" - but was ok";
        lhs.m_start = (char *)0x6;
        rhs.m_size = in_R9;
        rhs.m_start = (char *)0xd;
        operator+[abi_cxx11_(&local_40,(Catch *)0x18ed1d,lhs,rhs);
        passOrFail.m_size = local_40._M_string_length;
        passOrFail.m_start = local_40._M_dataplus._M_p;
        anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightGreen,passOrFail);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
      anon_unknown_23::AssertionPrinter::printOriginalExpression(&local_78);
      colour = FileName;
      anon_unknown_23::AssertionPrinter::printReconstructedExpression(&local_78);
      goto LAB_00156baf;
    }
  case Unknown:
switchD_00156958_caseD_ffffffff:
    passOrFail_03.m_size = 0x14;
    passOrFail_03.m_start = "** internal error **";
    anon_unknown_23::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_03);
  }
LAB_00156bbb:
  poVar2 = (this->super_StreamingReporterBase).stream;
  cVar3 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_78.messages);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded(AssertionStats const &_assertionStats) {
        AssertionResult const &result = _assertionStats.assertionResult;

        bool printInfoMessages = true;

        // Drop out if result was successful and we're not printing those
        if (!m_config->includeSuccessfulResults() && result.isOk()) {
            if (result.getResultType() != ResultWas::Warning)
                return false;
            printInfoMessages = false;
        }

        AssertionPrinter printer(stream, _assertionStats, printInfoMessages);
        printer.print();

        stream << std::endl;
        return true;
    }